

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_is_dir(char *file,wchar_t line,char *pathname,wchar_t mode)

{
  int iVar1;
  undefined1 local_c0 [4];
  wchar_t r;
  stat st;
  wchar_t mode_local;
  char *pathname_local;
  wchar_t line_local;
  char *file_local;
  
  st.__glibc_reserved[2]._4_4_ = mode;
  assertion_count(file,line);
  iVar1 = lstat(pathname,(stat *)local_c0);
  if (iVar1 == 0) {
    if (((uint)st.st_nlink & 0xf000) == 0x4000) {
      if ((st.__glibc_reserved[2]._4_4_ < L'\0') ||
         (st.__glibc_reserved[2]._4_4_ == ((uint)st.st_nlink & 0xfff))) {
        file_local._4_4_ = L'\x01';
      }
      else {
        failure_start(file,line,"Dir %s has wrong mode",pathname);
        logprintf("  Expected: 0%3o\n",(ulong)(uint)st.__glibc_reserved[2]._4_4_);
        logprintf("  Found: 0%3o\n",(ulong)((uint)st.st_nlink & 0xfff));
        failure_finish((void *)0x0);
        file_local._4_4_ = L'\0';
      }
    }
    else {
      failure_start(file,line,"%s is not a dir",pathname);
      failure_finish((void *)0x0);
      file_local._4_4_ = L'\0';
    }
  }
  else {
    failure_start(file,line,"Dir should exist: %s",pathname);
    failure_finish((void *)0x0);
    file_local._4_4_ = L'\0';
  }
  return file_local._4_4_;
}

Assistant:

int
assertion_is_dir(const char *file, int line, const char *pathname, int mode)
{
	struct stat st;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)mode; /* UNUSED */
#endif
	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line, "Dir should exist: %s", pathname);
		failure_finish(NULL);
		return (0);
	}
	if (!S_ISDIR(st.st_mode)) {
		failure_start(file, line, "%s is not a dir", pathname);
		failure_finish(NULL);
		return (0);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	/* Windows doesn't handle permissions the same way as POSIX,
	 * so just ignore the mode tests. */
	/* TODO: Can we do better here? */
	if (mode >= 0 && (mode_t)mode != (st.st_mode & 07777)) {
		failure_start(file, line, "Dir %s has wrong mode", pathname);
		logprintf("  Expected: 0%3o\n", (unsigned int)mode);
		logprintf("  Found: 0%3o\n", (unsigned int)st.st_mode & 07777);
		failure_finish(NULL);
		return (0);
	}
#endif
	return (1);
}